

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# treemodel.h
# Opt level: O2

void __thiscall TreeModel::TreeModel(TreeModel *this)

{
  TreeItem *this_00;
  CBString local_c0;
  CBString local_a8;
  UByteArray local_90;
  UByteArray local_70;
  UByteArray local_50;
  CBString local_30;
  
  this->markingEnabledFlag = false;
  this->markingDarkModeFlag = false;
  this_00 = (TreeItem *)operator_new(0x118);
  Bstrlib::CBString::CBString(&local_a8);
  Bstrlib::CBString::CBString(&local_c0);
  Bstrlib::CBString::CBString(&local_30);
  local_50.d._M_dataplus._M_p = (pointer)&local_50.d.field_2;
  local_50.d._M_string_length = 0;
  local_70.d._M_dataplus._M_p = (pointer)&local_70.d.field_2;
  local_70.d._M_string_length = 0;
  local_50.d.field_2._M_local_buf[0] = '\0';
  local_70.d.field_2._M_local_buf[0] = '\0';
  local_90.d._M_dataplus._M_p = (pointer)&local_90.d.field_2;
  local_90.d._M_string_length = 0;
  local_90.d.field_2._M_local_buf[0] = '\0';
  TreeItem::TreeItem(this_00,0,'<','\0',&local_a8,&local_c0,&local_30,&local_50,&local_70,&local_90,
                     true,false,(TreeItem *)0x0);
  this->rootItem = this_00;
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  Bstrlib::CBString::~CBString(&local_30);
  Bstrlib::CBString::~CBString(&local_c0);
  Bstrlib::CBString::~CBString(&local_a8);
  return;
}

Assistant:

TreeModel() : markingEnabledFlag(false), markingDarkModeFlag(false) {
        rootItem = new TreeItem(0, Types::Root, 0, UString(), UString(), UString(), UByteArray(), UByteArray(), UByteArray(), true, false);
    }